

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.cc
# Opt level: O3

void __thiscall tcmalloc::ThreadCache::ThreadCache(ThreadCache *this)

{
  int32_t iVar1;
  long lVar2;
  int32_t *piVar3;
  ulong uVar4;
  undefined8 ***local_18;
  uintptr_t sampler_seed;
  
  *(undefined8 *)((long)&(this->sampler_).bytes_until_sample_ + 1) = 0;
  *(undefined8 *)((long)&(this->sampler_).rnd_ + 1) = 0;
  this->size_ = 0;
  this->max_size_ = 0;
  (this->sampler_).bytes_until_sample_ = 0;
  IncreaseCacheLimitLocked(this);
  lVar2 = min_per_thread_cache_size_;
  if (this->max_size_ == 0) {
    this->max_size_ = (int32_t)min_per_thread_cache_size_;
    unclaimed_cache_space_ = unclaimed_cache_space_ - lVar2;
  }
  this->next_ = (ThreadCache *)0x0;
  this->prev_ = (ThreadCache *)0x0;
  if (DAT_0013c290 != 0) {
    piVar3 = &this->list_[0].size_;
    uVar4 = 0;
    do {
      iVar1 = (&DAT_0013bc84)[uVar4];
      ((FreeList *)(piVar3 + -6))->list_ = (void *)0x0;
      *(undefined8 *)(piVar3 + -4) = 0;
      *(undefined8 *)(piVar3 + -2) = 1;
      *piVar3 = iVar1;
      uVar4 = uVar4 + 1;
      piVar3 = piVar3 + 8;
    } while (uVar4 < DAT_0013c290);
  }
  local_18 = &local_18;
  Sampler::Init(&this->sampler_,(uint64_t)local_18);
  return;
}

Assistant:

ThreadCache::ThreadCache() {
  ASSERT(Static::pageheap_lock()->IsHeld());

  size_ = 0;

  max_size_ = 0;
  IncreaseCacheLimitLocked();
  if (max_size_ == 0) {
    // There isn't enough memory to go around.  Just give the minimum to
    // this thread.
    size_t min_size = min_per_thread_cache_size_.load(std::memory_order_relaxed);
    SetMaxSize(min_size);

    // Take unclaimed_cache_space_ negative.
    unclaimed_cache_space_ -= min_size;
    ASSERT(unclaimed_cache_space_ < 0);
  }

  next_ = nullptr;
  prev_ = nullptr;
  for (uint32_t cl = 0; cl < Static::num_size_classes(); ++cl) {
    list_[cl].Init(Static::sizemap()->class_to_size(cl));
  }

  uintptr_t sampler_seed;
  uintptr_t addr = reinterpret_cast<uintptr_t>(&sampler_seed);
  sampler_seed = addr;

  sampler_.Init(uint64_t{sampler_seed});
}